

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testToFloat.cpp
# Opt level: O1

uint halfToFloat(unsigned_short y)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined6 in_register_0000003a;
  ulong uVar5;
  
  uVar5 = CONCAT62(in_register_0000003a,y);
  uVar3 = (uint)(uVar5 >> 0xf) & 0x1ffff;
  uVar2 = (uint)(uVar5 >> 10) & 0x1f;
  uVar4 = (uint)uVar5 & 0x3ff;
  if (uVar2 == 0x1f) {
    uVar3 = uVar3 << 0x1f;
    if ((y & 0x3ff) != 0) {
      uVar3 = uVar3 | (uint)uVar5 << 0xd;
    }
    return uVar3 | 0x7f800000;
  }
  if ((y & 0x7c00) == 0) {
    if ((y & 0x3ff) == 0) {
      return uVar3 << 0x1f;
    }
    uVar1 = 0x1f;
    if ((y & 0x3ff) != 0) {
      for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar2 = (uVar1 ^ 0xffffffe0) + 0x17;
    uVar4 = uVar4 << (~(byte)uVar1 + 0xb & 0x1f) & 0x7ffffbfe;
  }
  return uVar2 * 0x800000 + 0x38000000 | uVar3 << 0x1f | uVar4 << 0xd;
}

Assistant:

unsigned int
halfToFloat (unsigned short y)
{

    int s = (y >> 15) & 0x00000001;
    int e = (y >> 10) & 0x0000001f;
    int m =  y        & 0x000003ff;

    if (e == 0)
    {
	if (m == 0)
	{
	    //
	    // Plus or minus zero
	    //

	    return s << 31;
	}
	else
	{
	    //
	    // Denormalized number -- renormalize it
	    //

	    while (!(m & 0x00000400))
	    {
		m <<= 1;
		e -=  1;
	    }

	    e += 1;
	    m &= ~0x00000400;
	}
    }
    else if (e == 31)
    {
	if (m == 0)
	{
	    //
	    // Positive or negative infinity
	    //

	    return (s << 31) | 0x7f800000;
	}
	else
	{
	    //
	    // Nan -- preserve sign and significand bits
	    //

	    return (s << 31) | 0x7f800000 | (m << 13);
	}
    }

    //
    // Normalized number
    //

    e = e + (127 - 15);
    m = m << 13;

    //
    // Assemble s, e and m.
    //

    return (s << 31) | (e << 23) | m;
}